

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vcgen_smooth_poly1.cpp
# Opt level: O1

void __thiscall
agg::vcgen_smooth_poly1::calculate
          (vcgen_smooth_poly1 *this,vertex_dist *v0,vertex_dist *v1,vertex_dist *v2,vertex_dist *v3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar10 = v1->dist;
  dVar9 = v0->dist / (v0->dist + dVar10);
  dVar10 = dVar10 / (v2->dist + dVar10);
  dVar1 = v0->y;
  dVar2 = v2->x;
  dVar3 = v2->y;
  dVar4 = v1->x;
  dVar5 = v1->y;
  dVar6 = v3->x;
  dVar7 = v3->y;
  dVar8 = this->m_smooth_value;
  this->m_ctrl1_x = (dVar2 - ((dVar2 - v0->x) * dVar9 + v0->x)) * dVar8 + dVar4;
  this->m_ctrl1_y = (dVar3 - ((dVar3 - dVar1) * dVar9 + dVar1)) * dVar8 + dVar5;
  this->m_ctrl2_x = (dVar4 - ((dVar6 - dVar4) * dVar10 + dVar4)) * dVar8 + dVar2;
  this->m_ctrl2_y = (dVar5 - ((dVar7 - dVar5) * dVar10 + dVar5)) * dVar8 + dVar3;
  return;
}

Assistant:

void vcgen_smooth_poly1::calculate(const vertex_dist& v0, 
                                       const vertex_dist& v1, 
                                       const vertex_dist& v2,
                                       const vertex_dist& v3)
    {

        double k1 = v0.dist / (v0.dist + v1.dist);
        double k2 = v1.dist / (v1.dist + v2.dist);

        double xm1 = v0.x + (v2.x - v0.x) * k1;
        double ym1 = v0.y + (v2.y - v0.y) * k1;
        double xm2 = v1.x + (v3.x - v1.x) * k2;
        double ym2 = v1.y + (v3.y - v1.y) * k2;

        m_ctrl1_x = v1.x + m_smooth_value * (v2.x - xm1);
        m_ctrl1_y = v1.y + m_smooth_value * (v2.y - ym1);
        m_ctrl2_x = v2.x + m_smooth_value * (v1.x - xm2);
        m_ctrl2_y = v2.y + m_smooth_value * (v1.y - ym2);
    }